

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

bool Truncate(string *path,size_t size,string *err)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = truncate((path->_M_dataplus)._M_p,size);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    strerror(*piVar2);
    std::__cxx11::string::assign((char *)err);
  }
  return -1 < iVar1;
}

Assistant:

bool Truncate(const string& path, size_t size, string* err) {
#ifdef _WIN32
  int fh = _sopen(path.c_str(), _O_RDWR | _O_CREAT, _SH_DENYNO,
                  _S_IREAD | _S_IWRITE);
  int success = _chsize(fh, size);
  _close(fh);
#else
  int success = truncate(path.c_str(), size);
#endif
  // Both truncate() and _chsize() return 0 on success and set errno and return
  // -1 on failure.
  if (success < 0) {
    *err = strerror(errno);
    return false;
  }
  return true;
}